

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigs.c
# Opt level: O2

int main(int argc,char **argv)

{
  addrinfo *paVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  ssize_t sVar8;
  undefined8 extraout_RDX;
  long lVar9;
  char *pcVar10;
  int sock;
  addrinfo **__pai;
  long lVar11;
  cmdCmd_t cmd;
  int iStack_100dc;
  int aiStack_100d8 [2];
  undefined4 uStack_100d0;
  int iStack_100cc;
  cmdCtlParse_t ctl;
  uintptr_t p [10];
  cmdScript_t s;
  char v [65536];
  
  pcVar5 = getenv("PIGPIO_PORT");
  pcVar10 = "8888";
  if (pcVar5 != (char *)0x0) {
    pcVar10 = pcVar5;
  }
  pcVar6 = getenv("PIGPIO_ADDR");
  pcVar5 = "localhost";
  if (pcVar6 != (char *)0x0) {
    pcVar5 = pcVar6;
  }
  v[0x10] = '\0';
  v[0x11] = '\0';
  v[0x12] = '\0';
  v[0x13] = '\0';
  v[0x14] = '\0';
  v[0x15] = '\0';
  v[0x16] = '\0';
  v[0x17] = '\0';
  v[0x18] = '\0';
  v[0x19] = '\0';
  v[0x1a] = '\0';
  v[0x1b] = '\0';
  v[0x1c] = '\0';
  v[0x1d] = '\0';
  v[0x1e] = '\0';
  v[0x1f] = '\0';
  v[0x20] = '\0';
  v[0x21] = '\0';
  v[0x22] = '\0';
  v[0x23] = '\0';
  v[0x24] = '\0';
  v[0x25] = '\0';
  v[0x26] = '\0';
  v[0x27] = '\0';
  v[0x28] = '\0';
  v[0x29] = '\0';
  v[0x2a] = '\0';
  v[0x2b] = '\0';
  v[0x2c] = '\0';
  v[0x2d] = '\0';
  v[0x2e] = '\0';
  v[0x2f] = '\0';
  v._0_12_ = ZEXT412(1) << 0x40;
  uVar2 = v._4_8_;
  v[0xc] = '\0';
  v[0xd] = '\0';
  v[0xe] = '\0';
  v[0xf] = '\0';
  v[4] = (char)uVar2;
  v[5] = (char)(uVar2 >> 8);
  v[6] = (char)(uVar2 >> 0x10);
  v[7] = (char)(uVar2 >> 0x18);
  v[8] = (char)(uVar2 >> 0x20);
  v[9] = (char)(uVar2 >> 0x28);
  v[10] = (char)(uVar2 >> 0x30);
  v[0xb] = (char)(uVar2 >> 0x38);
  v[0] = '\x02';
  v[1] = '\0';
  v[2] = '\0';
  v[3] = '\0';
  __pai = (addrinfo **)p;
  iVar3 = getaddrinfo(pcVar5,pcVar10,(addrinfo *)v,__pai);
  if (iVar3 == 0) {
    while (paVar1 = *__pai, paVar1 != (addrinfo *)0x0) {
      iStack_100dc = socket(paVar1->ai_family,paVar1->ai_socktype,paVar1->ai_protocol);
      if ((iStack_100dc != -1) &&
         (iVar3 = connect(iStack_100dc,paVar1->ai_addr,paVar1->ai_addrlen), iVar3 != -1))
      goto LAB_0010378b;
      __pai = &paVar1->ai_next;
    }
    iStack_100dc = -1;
LAB_0010378b:
    freeaddrinfo((addrinfo *)CONCAT44(p[0]._4_4_,(int)p[0]));
  }
  else {
    iStack_100dc = -1;
  }
  _opterr = 0;
  lVar9 = 1;
  do {
    iVar3 = getopt(argc,argv,"ax");
    if (iVar3 == 0x61) {
      printFlags._0_1_ = (byte)printFlags | 2;
    }
    else if (iVar3 == 0x78) {
      printFlags._0_1_ = (byte)printFlags | 1;
    }
    else {
      if (iVar3 == -1) break;
      report(0xfe,"ERROR: bad option %c",(ulong)_optopt);
    }
    lVar9 = lVar9 + 1;
  } while( true );
  command_buf[0] = '\0';
  iVar3 = 0;
  lVar11 = 0;
  for (; lVar9 < argc; lVar9 = lVar9 + 1) {
    pcVar10 = argv[lVar9];
    sVar7 = strlen(pcVar10);
    lVar11 = (long)(int)lVar11 + sVar7 + 1;
    if ((short)((ulong)lVar11 >> 0x10) == 0) {
      sprintf(command_buf + iVar3,"%s ",pcVar10);
      iVar3 = (int)lVar11;
    }
  }
  if (iVar3 != 0) {
    response_buf[(long)iVar3 + 0xffff] = '\0';
  }
  ctl.eaten = 0;
  sVar7 = strlen(command_buf);
  uVar4 = 0;
  iVar3 = 0;
LAB_001038a0:
  do {
    if (((int)uVar4 < 0) || ((int)sVar7 <= iVar3)) {
      if (-1 < iStack_100dc) {
        close(iStack_100dc);
      }
      return status;
    }
    uVar4 = cmdParse(command_buf,p,0x10000,v,&ctl);
    iVar3 = (int)p[0];
    if ((int)uVar4 < 0) {
      pcVar10 = cmdStr();
      if (uVar4 == 0xffffffff) {
        pcVar5 = "%s? unknown command, pigs h for help";
      }
      else {
        pcVar5 = "%s: bad parameter, pigs h for help";
      }
    }
    else {
      if ((int)p[0] < 800) {
        if ((int)p[0] != 0x30) {
          if ((int)p[0] == 0x19) {
            printf("%s",cmdUsage);
            iVar3 = ctl.eaten;
            goto LAB_001038a0;
          }
          aiStack_100d8[0] = (int)p[0];
          uStack_100d0 = (undefined4)p[2];
          iStack_100cc = (int)p[3];
          if (iStack_100dc == -1) {
            pcVar10 = "socket connect failed";
          }
          else {
            sVar8 = send(iStack_100dc,aiStack_100d8,0x10,0);
            if (sVar8 == 0x10) {
              if (CONCAT44(p[3]._4_4_,(int)p[3]) != 0) {
                send(iStack_100dc,v,CONCAT44(p[3]._4_4_,(int)p[3]),0);
              }
              sVar8 = recv(iStack_100dc,aiStack_100d8,0x10,0x100);
              if (sVar8 == 0x10) {
                sock = iStack_100dc;
                get_extensions(iStack_100dc,iVar3,iStack_100cc);
                cmd.field_3.p3 = iStack_100cc;
                cmd.p2 = uStack_100d0;
                cmd.cmd = (int)extraout_RDX;
                cmd.p1 = (int)((ulong)extraout_RDX >> 0x20);
                print_result(sock,cmdInfo[uVar4].rv,cmd);
                iVar3 = ctl.eaten;
                goto LAB_001038a0;
              }
              pcVar10 = "socket receive failed";
            }
            else {
              pcVar10 = "socket send failed";
            }
          }
          report(0xff,pcVar10);
          iVar3 = ctl.eaten;
          goto LAB_001038a0;
        }
        cmdParseScript(v,&s,1);
        free(s.par);
        iVar3 = ctl.eaten;
        goto LAB_001038a0;
      }
      pcVar10 = cmdInfo[uVar4].name;
      pcVar5 = "%s only allowed within a script";
    }
    report(0xfd,pcVar5,pcVar10);
    iVar3 = ctl.eaten;
  } while( true );
}

Assistant:

int main(int argc , char *argv[])
{
   int sock, command;
   int args, idx, i, pp, l, len;
   cmdCmd_t cmd;
   uintptr_t p[CMD_P_ARR];
   cmdCtlParse_t ctl;
   cmdScript_t s;
   char v[CMD_MAX_EXTENSION];

   sock = openSocket();

   args = initOpts(argc, argv);

   command_buf[0] = 0;
   l = 0;
   pp = 0;

   for (i=args; i<argc; i++)
   {
      l += (strlen(argv[i]) + 1);
      if (l < sizeof(command_buf))
         {sprintf(command_buf+pp, "%s ", argv[i]); pp=l;}
   }

   if (pp) {command_buf[--pp] = 0;}

   ctl.eaten = 0;

   len = strlen(command_buf);
   idx = 0;

   while ((idx >= 0) && (ctl.eaten < len))
   {
      if ((idx=cmdParse(command_buf, p, CMD_MAX_EXTENSION, v, &ctl)) >= 0)
      {
         command = p[0];

         if (command < PI_CMD_SCRIPT)
         {
            if (command == PI_CMD_HELP)
            {
               printf("%s", cmdUsage);
            }
            else if (command == PI_CMD_PARSE)
            {
               cmdParseScript(v, &s, 1);
               if (s.par) free (s.par);
            }
            else
            {
               cmd.cmd = command;
               cmd.p1 = p[1];
               cmd.p2 = p[2];
               cmd.p3 = p[3];

               if (sock != SOCKET_OPEN_FAILED)
               {
                  if (send(sock, &cmd, sizeof(cmdCmd_t), 0) ==
                     sizeof(cmdCmd_t))
                  {
                     if (p[3]) send(sock, v, p[3], 0); /* send extensions */

                     if (recv(sock, &cmd, sizeof(cmdCmd_t), MSG_WAITALL) ==
                        sizeof(cmdCmd_t))
                     {
                        get_extensions(sock, command, cmd.res);

                        print_result(sock, cmdInfo[idx].rv, cmd);
                     }
                     else report(PIGS_CONNECT_ERR, "socket receive failed");
                  }
                  else report(PIGS_CONNECT_ERR, "socket send failed");
               }
               else report(PIGS_CONNECT_ERR, "socket connect failed");
            }
         }
         else report(PIGS_SCRIPT_ERR,
                 "%s only allowed within a script", cmdInfo[idx].name);
      }
      else
      {
         if (idx == CMD_UNKNOWN_CMD)
            report(PIGS_SCRIPT_ERR,
               "%s? unknown command, pigs h for help", cmdStr());
         else
            report(PIGS_SCRIPT_ERR,
               "%s: bad parameter, pigs h for help", cmdStr());
      }
   }

   if (sock >= 0) close(sock);

   return status;
}